

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_getopt(nn_sockbase *self,int level,int option,void *optval,size_t *optvallen)

{
  nn_sockbase *local_38;
  nn_req *req;
  size_t *optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  nn_sockbase *self_local;
  int local_4;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  if (level == 0x30) {
    if (option == 1) {
      if (*optvallen < 4) {
        local_4 = -0x16;
      }
      else {
        *(undefined4 *)optval = *(undefined4 *)&local_38[0x38].vfptr;
        *optvallen = 4;
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x5c;
    }
  }
  else {
    local_4 = -0x5c;
  }
  return local_4;
}

Assistant:

int nn_req_getopt (struct nn_sockbase *self, int level, int option,
        void *optval, size_t *optvallen)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    if (level != NN_REQ)
        return -ENOPROTOOPT;

    if (option == NN_REQ_RESEND_IVL) {
        if (nn_slow (*optvallen < sizeof (int)))
            return -EINVAL;
        *(int*) optval = req->resend_ivl;
        *optvallen = sizeof (int);
        return 0;
    }

    return -ENOPROTOOPT;
}